

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void PathBezierCubicCurveToCasteljau
               (ImVector<ImVec2> *path,float x1,float y1,float x2,float y2,float x3,float y3,
               float x4,float y4,float tess_tol,int level)

{
  undefined1 auVar1 [16];
  float x3_00;
  float y3_00;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImVec2 *__dest;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  iVar8 = 10;
  if (10 < level) {
    iVar8 = level;
  }
  iVar7 = level + 1;
  while( true ) {
    fVar2 = x4 - x1;
    fVar3 = y4 - y1;
    fVar4 = (x2 - x4) * fVar3 - fVar2 * (y2 - y4);
    fVar5 = (x3 - x4) * fVar3 - fVar2 * (y3 - y4);
    auVar9._0_4_ = -fVar4;
    auVar9._4_4_ = 0x80000000;
    auVar9._8_4_ = 0x80000000;
    auVar9._12_4_ = 0x80000000;
    auVar1 = vcmpss_avx(auVar9,ZEXT416((uint)fVar4),2);
    auVar1 = vblendvps_avx(auVar9,ZEXT416((uint)fVar4),auVar1);
    auVar10._0_4_ = -fVar5;
    auVar10._4_4_ = 0x80000000;
    auVar10._8_4_ = 0x80000000;
    auVar10._12_4_ = 0x80000000;
    auVar9 = vcmpss_avx(auVar10,ZEXT416((uint)fVar5),2);
    auVar9 = vblendvps_avx(auVar10,ZEXT416((uint)fVar5),auVar9);
    fVar4 = auVar1._0_4_ + auVar9._0_4_;
    if (fVar4 * fVar4 < tess_tol * (fVar2 * fVar2 + fVar3 * fVar3)) {
      iVar8 = path->Size;
      if (iVar8 == path->Capacity) {
        if (iVar8 == 0) {
          iVar7 = 8;
        }
        else {
          iVar7 = iVar8 / 2 + iVar8;
        }
        iVar6 = iVar8 + 1;
        if (iVar8 + 1 < iVar7) {
          iVar6 = iVar7;
        }
        __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar6 << 3);
        if (path->Data != (ImVec2 *)0x0) {
          memcpy(__dest,path->Data,(long)path->Size << 3);
          ImGui::MemFree(path->Data);
        }
        path->Data = __dest;
        path->Capacity = iVar6;
        iVar8 = path->Size;
      }
      else {
        __dest = path->Data;
      }
      __dest[iVar8].x = x4;
      __dest[iVar8].y = y4;
      path->Size = path->Size + 1;
      return;
    }
    if (iVar7 - iVar8 == 1) break;
    fVar4 = (x2 + x1) * 0.5;
    fVar2 = (y2 + y1) * 0.5;
    fVar3 = (x2 + x3) * 0.5;
    fVar5 = (y2 + y3) * 0.5;
    x3 = (x4 + x3) * 0.5;
    y3 = (y4 + y3) * 0.5;
    x3_00 = (fVar4 + fVar3) * 0.5;
    y3_00 = (fVar2 + fVar5) * 0.5;
    x2 = (x3 + fVar3) * 0.5;
    y2 = (y3 + fVar5) * 0.5;
    fVar3 = (x2 + x3_00) * 0.5;
    fVar5 = (y3_00 + y2) * 0.5;
    PathBezierCubicCurveToCasteljau(path,x1,y1,fVar4,fVar2,x3_00,y3_00,fVar3,fVar5,tess_tol,iVar7);
    iVar7 = iVar7 + 1;
    x1 = fVar3;
    y1 = fVar5;
  }
  return;
}

Assistant:

static void PathBezierCubicCurveToCasteljau(ImVector<ImVec2>* path, float x1, float y1, float x2, float y2, float x3, float y3, float x4, float y4, float tess_tol, int level)
{
    float dx = x4 - x1;
    float dy = y4 - y1;
    float d2 = (x2 - x4) * dy - (y2 - y4) * dx;
    float d3 = (x3 - x4) * dy - (y3 - y4) * dx;
    d2 = (d2 >= 0) ? d2 : -d2;
    d3 = (d3 >= 0) ? d3 : -d3;
    if ((d2 + d3) * (d2 + d3) < tess_tol * (dx * dx + dy * dy))
    {
        path->push_back(ImVec2(x4, y4));
    }
    else if (level < 10)
    {
        float x12 = (x1 + x2) * 0.5f, y12 = (y1 + y2) * 0.5f;
        float x23 = (x2 + x3) * 0.5f, y23 = (y2 + y3) * 0.5f;
        float x34 = (x3 + x4) * 0.5f, y34 = (y3 + y4) * 0.5f;
        float x123 = (x12 + x23) * 0.5f, y123 = (y12 + y23) * 0.5f;
        float x234 = (x23 + x34) * 0.5f, y234 = (y23 + y34) * 0.5f;
        float x1234 = (x123 + x234) * 0.5f, y1234 = (y123 + y234) * 0.5f;
        PathBezierCubicCurveToCasteljau(path, x1, y1, x12, y12, x123, y123, x1234, y1234, tess_tol, level + 1);
        PathBezierCubicCurveToCasteljau(path, x1234, y1234, x234, y234, x34, y34, x4, y4, tess_tol, level + 1);
    }
}